

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_WahWah.cpp
# Opt level: O0

int WahWah::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  EffectData *pEVar1;
  Data *data;
  char *valuestr_local;
  float *value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<WahWah::EffectData>(state);
  if (index < 8) {
    if (value != (float *)0x0) {
      *value = *(float *)((long)&pEVar1->field_0 + (long)index * 4);
    }
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }